

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O3

void __thiscall
flatbuffers::vector_downward<unsigned_long>::fill_big
          (vector_downward<unsigned_long> *this,size_t zero_pad_bytes)

{
  uint8_t *__s;
  
  if (zero_pad_bytes == 0) {
    __s = this->cur_;
  }
  else {
    ensure_space(this,zero_pad_bytes);
    __s = this->cur_ + -zero_pad_bytes;
    this->cur_ = __s;
    this->size_ = this->size_ + zero_pad_bytes;
  }
  memset(__s,0,zero_pad_bytes);
  return;
}

Assistant:

void fill_big(size_t zero_pad_bytes) {
    memset(make_space(zero_pad_bytes), 0, zero_pad_bytes);
  }